

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O3

void __thiscall
duckdb::HivePartitionedColumnData::ComputePartitionIndices
          (HivePartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input)

{
  idx_t count;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  ulong __code;
  reference pvVar3;
  reference input_00;
  reference __k;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  size_type __n;
  size_type __n_00;
  HivePartitionKey local_50;
  
  count = input->count;
  DataChunk::Hash(input,&this->group_by_columns,&this->hashes_v);
  Vector::Flatten(&this->hashes_v,count);
  if ((this->group_by_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->group_by_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<unsigned_long,_true>::operator[](&this->group_by_columns,__n);
      input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,*pvVar3);
      GetHivePartitionValuesTypeSwitch(input_00,&this->keys,__n,count);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->group_by_columns).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->group_by_columns).
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (count != 0) {
    pdVar1 = (this->hashes_v).data;
    pdVar2 = (state->partition_indices).data;
    __n_00 = 0;
    do {
      __k = vector<duckdb::HivePartitionKey,_true>::operator[](&this->keys,__n_00);
      __code = *(ulong *)(pdVar1 + __n_00 * 8);
      __k->hash = __code;
      p_Var4 = std::
               _Hashtable<duckdb::HivePartitionKey,_std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_std::allocator<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::HivePartitionKey::Equality,_duckdb::HivePartitionKey::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&(this->local_partition_map)._M_h,
                          __code % (this->local_partition_map)._M_h._M_bucket_count,__k,__code);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_50,
                   (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__k);
        local_50.hash = __k->hash;
        p_Var5 = (_Hash_node_base *)RegisterNewPartition(this,&local_50,state);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_50);
      }
      else {
        p_Var5 = p_Var4->_M_nxt[5]._M_nxt;
      }
      *(_Hash_node_base **)(pdVar2 + __n_00 * 8) = p_Var5;
      __n_00 = __n_00 + 1;
    } while (count != __n_00);
  }
  return;
}

Assistant:

void HivePartitionedColumnData::ComputePartitionIndices(PartitionedColumnDataAppendState &state, DataChunk &input) {
	const auto count = input.size();

	input.Hash(group_by_columns, hashes_v);
	hashes_v.Flatten(count);

	for (idx_t col_idx = 0; col_idx < group_by_columns.size(); col_idx++) {
		auto &group_by_col = input.data[group_by_columns[col_idx]];
		GetHivePartitionValuesTypeSwitch(group_by_col, keys, col_idx, count);
	}

	const auto hashes = FlatVector::GetData<hash_t>(hashes_v);
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	for (idx_t i = 0; i < count; i++) {
		auto &key = keys[i];
		key.hash = hashes[i];
		auto lookup = local_partition_map.find(key);
		if (lookup == local_partition_map.end()) {
			idx_t new_partition_id = RegisterNewPartition(key, state);
			partition_indices[i] = new_partition_id;
		} else {
			partition_indices[i] = lookup->second;
		}
	}
}